

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib506.c
# Opt level: O2

void my_lock(CURL *handle,curl_lock_data data,curl_lock_access laccess,void *useptr)

{
  undefined *puVar1;
  uint uVar2;
  
  uVar2 = data - CURL_LOCK_DATA_SHARE;
  if (2 < uVar2) {
    curl_mfprintf(_stderr,"lock: no such data: %d\n");
    return;
  }
  puVar1 = (&PTR_anon_var_dwarf_343_00103d88)[uVar2];
  if (locks[*(long *)(&DAT_001024e8 + (ulong)uVar2 * 8)] != 0) {
    curl_mprintf("lock: double locked %s\n",puVar1);
    return;
  }
  locks[*(long *)(&DAT_001024e8 + (ulong)uVar2 * 8)] = 1;
  curl_mprintf("lock:   %-6s [%s]: %d\n",puVar1,*useptr,*(undefined4 *)((long)useptr + 8));
  *(int *)((long)useptr + 8) = *(int *)((long)useptr + 8) + 1;
  return;
}

Assistant:

static void my_lock(CURL *handle, curl_lock_data data,
                    curl_lock_access laccess, void *useptr)
{
  const char *what;
  struct userdata *user = (struct userdata *)useptr;
  int locknum;

  (void)handle;
  (void)laccess;

  switch(data) {
    case CURL_LOCK_DATA_SHARE:
      what = "share";
      locknum = 0;
      break;
    case CURL_LOCK_DATA_DNS:
      what = "dns";
      locknum = 1;
      break;
    case CURL_LOCK_DATA_COOKIE:
      what = "cookie";
      locknum = 2;
      break;
    default:
      fprintf(stderr, "lock: no such data: %d\n", (int)data);
      return;
  }

  /* detect locking of locked locks */
  if(locks[locknum]) {
    printf("lock: double locked %s\n", what);
    return;
  }
  locks[locknum]++;

  printf("lock:   %-6s [%s]: %d\n", what, user->text, user->counter);
  user->counter++;
}